

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyMessageImpl *
formatAccessReport(TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,
                  __va_list_tag *args)

{
  TidyMessageImpl *pTVar1;
  __va_list_tag *args_local;
  uint level_local;
  uint code_local;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  doc->badAccess = doc->badAccess | 0x80000000;
  pTVar1 = prvTidytidyMessageCreateWithNode(doc,node,code,level);
  return pTVar1;
}

Assistant:

TidyMessageImpl *formatAccessReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    doc->badAccess |= BA_WAI;

    /* Currently *all* cases are handled in the default, but maintain this
       structure for possible future cases. */
    switch (code)
    {
        default:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level );
    }

    return NULL;
}